

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void accumulate_frame_motion_stats
               (FIRSTPASS_STATS *stats,GF_GROUP_STATS *gf_stats,double f_w,double f_h)

{
  double dVar1;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  double mvc_ratio;
  double mvr_ratio;
  double pct;
  double f_h_local;
  double f_w_local;
  GF_GROUP_STATS *gf_stats_local;
  FIRSTPASS_STATS *stats_local;
  
  dVar1 = stats->pcnt_motion;
  gf_stats->this_frame_mv_in_out = stats->mv_in_out_count * dVar1;
  gf_stats->mv_in_out_accumulator = gf_stats->this_frame_mv_in_out + gf_stats->mv_in_out_accumulator
  ;
  gf_stats->abs_mv_in_out_accumulator =
       ABS(gf_stats->this_frame_mv_in_out) + gf_stats->abs_mv_in_out_accumulator;
  if (0.05 < dVar1) {
    if (0.0 <= ABS(stats->MVr)) {
      local_48 = ABS(stats->MVr) + 1e-06;
    }
    else {
      local_48 = ABS(stats->MVr) - 1e-06;
    }
    local_68 = ABS(stats->mvr_abs) / local_48;
    if (0.0 <= ABS(stats->MVc)) {
      local_58 = ABS(stats->MVc) + 1e-06;
    }
    else {
      local_58 = ABS(stats->MVc) - 1e-06;
    }
    local_78 = ABS(stats->mvc_abs) / local_58;
    if (stats->mvr_abs * f_h <= local_68) {
      local_68 = stats->mvr_abs * f_h;
    }
    gf_stats->mv_ratio_accumulator = dVar1 * local_68 + gf_stats->mv_ratio_accumulator;
    if (stats->mvc_abs * f_w <= local_78) {
      local_78 = stats->mvc_abs * f_w;
    }
    gf_stats->mv_ratio_accumulator = dVar1 * local_78 + gf_stats->mv_ratio_accumulator;
  }
  return;
}

Assistant:

static void accumulate_frame_motion_stats(const FIRSTPASS_STATS *stats,
                                          GF_GROUP_STATS *gf_stats, double f_w,
                                          double f_h) {
  const double pct = stats->pcnt_motion;

  // Accumulate Motion In/Out of frame stats.
  gf_stats->this_frame_mv_in_out = stats->mv_in_out_count * pct;
  gf_stats->mv_in_out_accumulator += gf_stats->this_frame_mv_in_out;
  gf_stats->abs_mv_in_out_accumulator += fabs(gf_stats->this_frame_mv_in_out);

  // Accumulate a measure of how uniform (or conversely how random) the motion
  // field is (a ratio of abs(mv) / mv).
  if (pct > 0.05) {
    const double mvr_ratio =
        fabs(stats->mvr_abs) / DOUBLE_DIVIDE_CHECK(fabs(stats->MVr));
    const double mvc_ratio =
        fabs(stats->mvc_abs) / DOUBLE_DIVIDE_CHECK(fabs(stats->MVc));

    gf_stats->mv_ratio_accumulator +=
        pct *
        (mvr_ratio < stats->mvr_abs * f_h ? mvr_ratio : stats->mvr_abs * f_h);
    gf_stats->mv_ratio_accumulator +=
        pct *
        (mvc_ratio < stats->mvc_abs * f_w ? mvc_ratio : stats->mvc_abs * f_w);
  }
}